

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

int encode_ubyte_value(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,uchar value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  uchar local_9;
  
  local_9 = value;
  iVar1 = (*encoder_output)(context,&local_9,1);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x9a8;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"encode_ubyte_value",0x9a7,1,"Failed encoding ubyte value");
    }
  }
  return iVar1;
}

Assistant:

static int encode_ubyte_value(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, unsigned char value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_275: [<encoding code="0x50" category="fixed" width="1" label="8-bit unsigned integer"/>] */
    if (output_byte(encoder_output, context, value) != 0)
    {
        /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
        LogError("Failed encoding ubyte value");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
        result = 0;
    }

    return result;
}